

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_keyinput(Terminal *term,wchar_t codepage,void *str,wchar_t len)

{
  char *__s;
  wchar_t wVar1;
  strbuf *buf_o;
  size_t sVar3;
  size_t sVar2;
  
  if ((L'\xffffffff' < codepage) && (term->ucsdata->line_codepage != codepage)) {
    buf_o = term_input_data_from_charset(term,codepage,(char *)str,len);
    sVar3 = buf_o->len;
    if (sVar3 != 0) {
      __s = buf_o->s;
      wVar1 = (wchar_t)sVar3;
      if (term->srm_echo == true) {
        if (wVar1 < L'\0') {
          sVar3 = strlen(__s);
        }
        bufchain_add(&term->inbuf,__s,(long)(int)sVar3);
        term_added_data(term,false);
      }
      if (term->bracketed_paste_active == true) {
        if (term->ldisc != (Ldisc *)0x0) {
          ldisc_send(term->ldisc,"\x1b[201~",L'\x06',false);
        }
        term->bracketed_paste_active = false;
      }
      if (term->ldisc != (Ldisc *)0x0) {
        ldisc_send(term->ldisc,__s,wVar1,true);
      }
      term_seen_key_event(term);
    }
    strbuf_free(buf_o);
    return;
  }
  if (term->srm_echo == true) {
    wVar1 = len;
    if (len < L'\0') {
      sVar2 = strlen((char *)str);
      wVar1 = (wchar_t)sVar2;
    }
    bufchain_add(&term->inbuf,str,(long)wVar1);
    term_added_data(term,false);
  }
  if (term->bracketed_paste_active == true) {
    if (term->ldisc != (Ldisc *)0x0) {
      ldisc_send(term->ldisc,"\x1b[201~",L'\x06',false);
    }
    term->bracketed_paste_active = false;
  }
  if (term->ldisc != (Ldisc *)0x0) {
    ldisc_send(term->ldisc,str,len,true);
  }
  term_seen_key_event(term);
  return;
}

Assistant:

void term_keyinput(Terminal *term, int codepage, const void *str, int len)
{
    if (codepage < 0 || codepage == term->ucsdata->line_codepage) {
        /*
         * This text needs no translation, either because it's already
         * in the right character set, or because we got the special
         * codepage value -1 from our caller which means 'this data
         * should be charset-agnostic, just send it raw' (for really
         * simple things like control characters).
         */
        term_keyinput_internal(term, str, len, true);
    } else {
        strbuf *buf = term_input_data_from_charset(term, codepage, str, len);
        if (buf->len)
            term_keyinput_internal(term, buf->s, buf->len, true);
        strbuf_free(buf);
    }
}